

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::SlidingWindowsLayerParams::_InternalSerialize
          (SlidingWindowsLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  void *data;
  bool bVar1;
  uint8_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  int size;
  ulong uVar5;
  uint8_t *ptr;
  size_t __n;
  
  uVar3 = this->axis_;
  if (uVar3 != 0) {
    puVar2 = target;
    if (stream->end_ <= target) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar3 = this->axis_;
    }
    *puVar2 = '\b';
    puVar2[1] = (byte)uVar3;
    if (uVar3 < 0x80) {
      target = puVar2 + 2;
    }
    else {
      puVar2[1] = (byte)uVar3 | 0x80;
      puVar2[2] = (uint8_t)(uVar3 >> 7);
      target = puVar2 + 3;
      if (0x3fff < uVar3) {
        uVar5 = (ulong)puVar2[2];
        uVar3 = uVar3 >> 7;
        do {
          target[-1] = (byte)uVar5 | 0x80;
          uVar4 = uVar3 >> 7;
          *target = (uint8_t)uVar4;
          target = target + 1;
          uVar5 = uVar4 & 0xffffffff;
          bVar1 = 0x3fff < uVar3;
          uVar3 = uVar4;
        } while (bVar1);
      }
    }
  }
  uVar3 = this->windowsize_;
  puVar2 = target;
  if (uVar3 != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar3 = this->windowsize_;
    }
    *target = '\x10';
    target[1] = (byte)uVar3;
    if (uVar3 < 0x80) {
      puVar2 = target + 2;
    }
    else {
      target[1] = (byte)uVar3 | 0x80;
      target[2] = (uint8_t)(uVar3 >> 7);
      puVar2 = target + 3;
      if (0x3fff < uVar3) {
        uVar5 = (ulong)target[2];
        uVar3 = uVar3 >> 7;
        do {
          puVar2[-1] = (byte)uVar5 | 0x80;
          uVar4 = uVar3 >> 7;
          *puVar2 = (uint8_t)uVar4;
          puVar2 = puVar2 + 1;
          uVar5 = uVar4 & 0xffffffff;
          bVar1 = 0x3fff < uVar3;
          uVar3 = uVar4;
        } while (bVar1);
      }
    }
  }
  uVar3 = this->step_;
  ptr = puVar2;
  if (uVar3 != 0) {
    if (stream->end_ <= puVar2) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar2);
      uVar3 = this->step_;
    }
    *puVar2 = '\x18';
    puVar2[1] = (byte)uVar3;
    if (uVar3 < 0x80) {
      ptr = puVar2 + 2;
    }
    else {
      puVar2[1] = (byte)uVar3 | 0x80;
      puVar2[2] = (uint8_t)(uVar3 >> 7);
      ptr = puVar2 + 3;
      if (0x3fff < uVar3) {
        uVar5 = (ulong)puVar2[2];
        uVar3 = uVar3 >> 7;
        do {
          ptr[-1] = (byte)uVar5 | 0x80;
          uVar4 = uVar3 >> 7;
          *ptr = (uint8_t)uVar4;
          ptr = ptr + 1;
          uVar5 = uVar4 & 0xffffffff;
          bVar1 = 0x3fff < uVar3;
          uVar3 = uVar4;
        } while (bVar1);
      }
    }
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    uVar3 = uVar3 & 0xfffffffffffffffc;
    data = *(void **)(uVar3 + 8);
    size = (int)*(undefined8 *)(uVar3 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)ptr < (long)__n) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,ptr);
      return puVar2;
    }
    memcpy(ptr,data,__n);
    ptr = ptr + __n;
  }
  return ptr;
}

Assistant:

uint8_t* SlidingWindowsLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.SlidingWindowsLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 axis = 1;
  if (this->_internal_axis() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(1, this->_internal_axis(), target);
  }

  // uint64 windowSize = 2;
  if (this->_internal_windowsize() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(2, this->_internal_windowsize(), target);
  }

  // uint64 step = 3;
  if (this->_internal_step() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(3, this->_internal_step(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.SlidingWindowsLayerParams)
  return target;
}